

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O1

Ivy_Man_t * Ivy_ManStartFrom(Ivy_Man_t *p)

{
  void *pvVar1;
  Ivy_Man_t *p_00;
  Vec_Ptr_t *pVVar2;
  Ivy_Obj_t *pIVar3;
  long lVar4;
  
  p_00 = Ivy_ManStart();
  p->pConst1->pEquiv = p_00->pConst1;
  pVVar2 = p->vPis;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = pVVar2->pArray[lVar4];
      pIVar3 = Ivy_ObjCreatePi(p_00);
      *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar3;
      lVar4 = lVar4 + 1;
      pVVar2 = p->vPis;
    } while (lVar4 < pVVar2->nSize);
  }
  return p_00;
}

Assistant:

Ivy_Man_t * Ivy_ManStartFrom( Ivy_Man_t * p )
{
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Ivy_ManStart();
    // create the PIs
    Ivy_ManConst1(p)->pEquiv = Ivy_ManConst1(pNew);
    Ivy_ManForEachPi( p, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    return pNew;
}